

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O1

void __thiscall
crnlib::
hash_map<crnlib::vec<6U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<6U,_float>_>,_crnlib::equal_to<crnlib::vec<6U,_float>_>_>
::rehash(hash_map<crnlib::vec<6U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<6U,_float>_>,_crnlib::equal_to<crnlib::vec<6U,_float>_>_>
         *this,uint new_hash_size)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  uint32 uVar7;
  uint uVar8;
  raw_node *prVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  raw_node *prVar14;
  raw_node *prVar15;
  hash_map<crnlib::vec<6U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<6U,_float>_>,_crnlib::equal_to<crnlib::vec<6U,_float>_>_>
  new_map;
  elemental_vector local_48;
  uint local_38;
  undefined8 local_30;
  
  if ((this->m_num_valid <= new_hash_size) &&
     (uVar11 = (ulong)new_hash_size, (this->m_values).m_size != new_hash_size)) {
    local_48.m_p = (raw_node *)0x0;
    local_48.m_size = 0;
    local_48.m_capacity = 0;
    local_38 = 0x20;
    local_30 = 0;
    if (new_hash_size != 0) {
      if (new_hash_size != 0) {
        elemental_vector::increase_capacity
                  (&local_48,new_hash_size,new_hash_size == 1,0x20,
                   vector<crnlib::hash_map<crnlib::vec<6U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<6U,_float>_>,_crnlib::equal_to<crnlib::vec<6U,_float>_>_>::raw_node>
                   ::object_mover,false);
      }
      if (new_hash_size - local_48.m_size != 0) {
        lVar10 = 0;
        do {
          ((raw_node *)((long)local_48.m_p + (local_48._8_8_ & 0xffffffff) * 0x20))->m_bits
          [lVar10 + 0x1c] = '\0';
          lVar10 = lVar10 + 0x20;
        } while ((ulong)(new_hash_size - local_48.m_size) << 5 != lVar10);
      }
      local_48.m_size = new_hash_size;
    }
    local_38 = 0x20;
    if (1 < new_hash_size) {
      do {
        local_38 = local_38 - 1;
        uVar8 = (uint)uVar11;
        uVar11 = uVar11 >> 1;
      } while (3 < uVar8);
    }
    local_30._4_4_ = 0xffffffff;
    uVar11 = (ulong)(this->m_values).m_size;
    if (uVar11 != 0) {
      prVar14 = (this->m_values).m_p;
      prVar15 = prVar14 + uVar11;
      do {
        if (prVar14->m_bits[0x1c] != '\0') {
          uVar7 = fast_hash(prVar14,0x18);
          uVar8 = uVar7 * -0x61c88647 >> ((byte)local_38 & 0x1f);
          prVar9 = (raw_node *)((long)local_48.m_p + (ulong)uVar8 * 0x20);
          if (((raw_node *)((long)local_48.m_p + (ulong)uVar8 * 0x20))->m_bits[0x1c] != '\0') {
            uVar13 = uVar8;
            do {
              uVar12 = uVar13 - 1;
              if (uVar13 == 0) {
                uVar12 = local_48.m_size - 1;
              }
              if (uVar12 == uVar8) goto LAB_001842db;
              prVar9 = prVar9 + -1;
              if (uVar13 == 0) {
                prVar9 = (raw_node *)((long)local_48.m_p + (ulong)(local_48.m_size - 1) * 0x20);
              }
              uVar13 = uVar12;
            } while (prVar9->m_bits[0x1c] != '\0');
          }
          uVar4 = *(undefined8 *)prVar14->m_bits;
          uVar5 = *(undefined8 *)(prVar14->m_bits + 8);
          uVar6 = *(undefined8 *)(prVar14->m_bits + 0x18);
          *(undefined8 *)(prVar9->m_bits + 0x10) = *(undefined8 *)(prVar14->m_bits + 0x10);
          *(undefined8 *)(prVar9->m_bits + 0x18) = uVar6;
          *(undefined8 *)prVar9->m_bits = uVar4;
          *(undefined8 *)(prVar9->m_bits + 8) = uVar5;
          prVar14->m_bits[0x1c] = '\0';
          local_30._0_4_ = (uint)local_30 + 1;
LAB_001842db:
          if ((uint)local_30 == this->m_num_valid) break;
        }
        prVar14 = prVar14 + 1;
      } while (prVar14 != prVar15);
    }
    local_30._4_4_ = new_hash_size + 1 >> 1;
    prVar14 = (this->m_values).m_p;
    if (prVar14 != (raw_node *)0x0) {
      crnlib_free(prVar14);
      (this->m_values).m_p = (raw_node *)0x0;
      (this->m_values).m_size = 0;
      (this->m_values).m_capacity = 0;
    }
    this->m_hash_shift = 0x20;
    prVar14 = (this->m_values).m_p;
    (this->m_values).m_p = (raw_node *)local_48.m_p;
    uVar1 = (this->m_values).m_size;
    (this->m_values).m_size = local_48.m_size;
    uVar2 = (this->m_values).m_capacity;
    (this->m_values).m_capacity = local_48.m_capacity;
    local_48.m_capacity = uVar2;
    local_48.m_size = uVar1;
    this->m_hash_shift = local_38;
    local_38 = 0x20;
    uVar2 = this->m_num_valid;
    this->m_num_valid = (uint)local_30;
    uVar3 = this->m_grow_threshold;
    this->m_grow_threshold = local_30._4_4_;
    local_30 = CONCAT44(uVar3,uVar2);
    local_48.m_p = prVar14;
    if (uVar1 != 0) {
      if (prVar14 != (raw_node *)0x0) {
        crnlib_free(prVar14);
        local_48.m_p = (raw_node *)0x0;
        local_48.m_size = 0;
        local_48.m_capacity = 0;
      }
      local_30 = 0;
    }
    local_38 = 0x20;
    if ((raw_node *)local_48.m_p != (raw_node *)0x0) {
      crnlib_free(local_48.m_p);
    }
  }
  return;
}

Assistant:

inline void rehash(uint new_hash_size)
        {
            CRNLIB_ASSERT(new_hash_size >= m_num_valid);
            CRNLIB_ASSERT(math::is_power_of_2(new_hash_size));

            if ((new_hash_size < m_num_valid) || (new_hash_size == m_values.size()))
            {
                return;
            }

            hash_map new_map;
            new_map.m_values.resize(new_hash_size);
            new_map.m_hash_shift = 32U - math::floor_log2i(new_hash_size);
            CRNLIB_ASSERT(new_hash_size == (1U << (32U - new_map.m_hash_shift)));
            new_map.m_grow_threshold = UINT_MAX;

            node* pNode = reinterpret_cast<node*>(m_values.begin());
            node* pNode_end = pNode + m_values.size();

            while (pNode != pNode_end)
            {
                if (pNode->state)
                {
                    new_map.move_into(pNode);

                    if (new_map.m_num_valid == m_num_valid)
                    {
                        break;
                    }
                }

                pNode++;
            }

            new_map.m_grow_threshold = (new_hash_size + 1U) >> 1U;

            m_values.clear_no_destruction();
            m_hash_shift = 32;

            swap(new_map);
        }